

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
SmallArray<VmModule::LoadStoreInfo,_32U>::grow
          (SmallArray<VmModule::LoadStoreInfo,_32U> *this,uint newSize)

{
  Allocator *pAVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  LoadStoreInfo *pLVar4;
  long lVar5;
  uint uVar6;
  LoadStoreInfo *pLVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  byte bVar12;
  
  bVar12 = 0;
  uVar6 = (this->max >> 1) + this->max;
  uVar2 = newSize + 4;
  if (newSize < uVar6) {
    uVar2 = uVar6;
  }
  pAVar1 = this->allocator;
  if (pAVar1 == (Allocator *)0x0) {
    pLVar4 = (LoadStoreInfo *)(*(code *)NULLC::alloc)(uVar2 * 0x58 | 4);
    if (uVar2 != 0) {
      pLVar7 = pLVar4;
      do {
        *(undefined8 *)((long)&pLVar7->storeInst + 4) = 0;
        *(undefined8 *)((long)&pLVar7->copyInst + 4) = 0;
        pLVar7->loadInst = (VmInstruction *)0x0;
        pLVar7->storeInst = (VmInstruction *)0x0;
        pLVar7->loadAddress = (VmConstant *)0x0;
        pLVar7->loadPointer = (VmValue *)0x0;
        pLVar7->loadOffset = (VmConstant *)0x0;
        pLVar7->storeAddress = (VmConstant *)0x0;
        pLVar7->storePointer = (VmValue *)0x0;
        pLVar7->storeOffset = (VmConstant *)0x0;
        pLVar7->noLoadOrNoContainerAlias = false;
        pLVar7->noStoreOrNoContainerAlias = false;
        pLVar7 = pLVar7 + 1;
      } while (pLVar7 != pLVar4 + (int)uVar2);
    }
  }
  else {
    iVar3 = (*pAVar1->_vptr_Allocator[2])(pAVar1,(ulong)(uVar2 * 0x58 | 4));
    pLVar4 = (LoadStoreInfo *)CONCAT44(extraout_var,iVar3);
    if (uVar2 != 0) {
      pLVar7 = pLVar4;
      do {
        *(undefined8 *)((long)&pLVar7->storeInst + 4) = 0;
        *(undefined8 *)((long)&pLVar7->copyInst + 4) = 0;
        pLVar7->loadInst = (VmInstruction *)0x0;
        pLVar7->storeInst = (VmInstruction *)0x0;
        pLVar7->loadAddress = (VmConstant *)0x0;
        pLVar7->loadPointer = (VmValue *)0x0;
        pLVar7->loadOffset = (VmConstant *)0x0;
        pLVar7->storeAddress = (VmConstant *)0x0;
        pLVar7->storePointer = (VmValue *)0x0;
        pLVar7->storeOffset = (VmConstant *)0x0;
        pLVar7->noLoadOrNoContainerAlias = false;
        pLVar7->noStoreOrNoContainerAlias = false;
        pLVar7 = pLVar7 + 1;
      } while (pLVar7 != pLVar4 + (int)uVar2);
    }
  }
  if (this->count != 0) {
    lVar5 = 0;
    uVar9 = 0;
    do {
      pLVar7 = this->data;
      *(undefined2 *)(&pLVar4->noLoadOrNoContainerAlias + lVar5) =
           *(undefined2 *)(&pLVar7->noLoadOrNoContainerAlias + lVar5);
      puVar10 = (undefined8 *)((long)&pLVar7->loadInst + lVar5);
      puVar11 = (undefined8 *)((long)&pLVar4->loadInst + lVar5);
      for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar11 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
      }
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + 0x58;
    } while (uVar9 < this->count);
  }
  pLVar7 = this->data;
  if (pLVar7 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pLVar7 != (LoadStoreInfo *)0x0) {
        (*(code *)NULLC::dealloc)(pLVar7);
      }
    }
    else if (pLVar7 != (LoadStoreInfo *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pLVar4;
  this->max = uVar2;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}